

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourcesGL::ShaderResourcesGL(ShaderResourcesGL *this,ShaderResourcesGL *Program)

{
  ShaderResourcesGL *Program_local;
  ShaderResourcesGL *this_local;
  
  this->m_ShaderStages = Program->m_ShaderStages;
  this->m_UniformBuffers = Program->m_UniformBuffers;
  this->m_Textures = Program->m_Textures;
  this->m_Images = Program->m_Images;
  this->m_StorageBlocks = Program->m_StorageBlocks;
  this->m_NumUniformBuffers = Program->m_NumUniformBuffers;
  this->m_NumTextures = Program->m_NumTextures;
  this->m_NumImages = Program->m_NumImages;
  this->m_NumStorageBlocks = Program->m_NumStorageBlocks;
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::unique_ptr
            (&this->m_UBReflectionBuffer,&Program->m_UBReflectionBuffer);
  Program->m_UniformBuffers = (UniformBufferInfo *)0x0;
  Program->m_Textures = (TextureInfo *)0x0;
  Program->m_Images = (ImageInfo *)0x0;
  Program->m_StorageBlocks = (StorageBlockInfo *)0x0;
  Program->m_NumUniformBuffers = 0;
  Program->m_NumTextures = 0;
  Program->m_NumImages = 0;
  Program->m_NumStorageBlocks = 0;
  return;
}

Assistant:

ShaderResourcesGL::ShaderResourcesGL(ShaderResourcesGL&& Program) noexcept :
    // clang-format off
    m_ShaderStages      {Program.m_ShaderStages     },
    m_UniformBuffers    {Program.m_UniformBuffers   },
    m_Textures          {Program.m_Textures         },
    m_Images            {Program.m_Images           },
    m_StorageBlocks     {Program.m_StorageBlocks    },
    m_NumUniformBuffers {Program.m_NumUniformBuffers},
    m_NumTextures       {Program.m_NumTextures      },
    m_NumImages         {Program.m_NumImages        },
    m_NumStorageBlocks  {Program.m_NumStorageBlocks },
    m_UBReflectionBuffer{std::move(Program.m_UBReflectionBuffer)}
// clang-format on
{
    Program.m_UniformBuffers = nullptr;
    Program.m_Textures       = nullptr;
    Program.m_Images         = nullptr;
    Program.m_StorageBlocks  = nullptr;

    Program.m_NumUniformBuffers = 0;
    Program.m_NumTextures       = 0;
    Program.m_NumImages         = 0;
    Program.m_NumStorageBlocks  = 0;
}